

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

bool __thiscall
duckdb::BitpackingState<int,_int>::Flush<duckdb::EmptyBitpackingWriter>
          (BitpackingState<int,_int> *this)

{
  int *piVar1;
  uint uVar2;
  bool bVar3;
  idx_t iVar4;
  unsigned_long uVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  ulong uVar9;
  byte bVar10;
  ulong uVar11;
  bool bVar12;
  int iVar13;
  uint uVar14;
  int left;
  ulong uVar15;
  
  bVar12 = true;
  if (this->compression_buffer_idx == 0) {
    return true;
  }
  if (this->all_invalid == false) {
    iVar13 = this->minimum;
    left = this->maximum;
    if (left != iVar13) goto LAB_0171b2b4;
  }
  if ((byte)(this->mode - AUTO) < 2) {
    this->total_size = this->total_size + 8;
    return true;
  }
  iVar13 = this->minimum;
  left = this->maximum;
LAB_0171b2b4:
  piVar1 = &this->min_max_diff;
  bVar3 = TrySubtractOperator::Operation<int,int,int>(left,iVar13,piVar1);
  this->can_do_for = bVar3;
  CalculateDeltaStats(this);
  if (this->can_do_delta == true) {
    iVar13 = this->minimum_delta;
    if ((this->maximum_delta == iVar13) && ((this->mode & ~AUTO) != DELTA_FOR)) {
      this->total_size = this->total_size + 0xc;
      return true;
    }
    if (this->min_max_delta_diff == 0) {
      bVar8 = 0;
    }
    else {
      bVar10 = 0;
      uVar14 = this->min_max_delta_diff;
      do {
        bVar10 = bVar10 + 1;
        bVar3 = 1 < uVar14;
        uVar14 = (int)uVar14 >> 1;
      } while (bVar3);
      bVar8 = 0x20;
      if (bVar10 < 0x1d) {
        bVar8 = bVar10;
      }
    }
    uVar14 = *piVar1;
    if (uVar14 == 0) {
      bVar7 = 0;
    }
    else {
      uVar2 = -uVar14;
      if (0 < (int)uVar14) {
        uVar2 = uVar14;
      }
      uVar15 = (ulong)uVar2;
      bVar10 = 0;
      do {
        bVar6 = bVar10;
        uVar15 = uVar15 >> 1;
        bVar10 = bVar6 + 1;
        bVar3 = 1 < uVar2;
        uVar2 = (uint)uVar15;
      } while (bVar3);
      bVar7 = 0x20;
      if (bVar10 < 0x1c) {
        bVar7 = bVar6 + 2;
      }
    }
    if ((bVar8 < bVar7) && (this->mode != FOR)) {
      uVar15 = this->compression_buffer_idx;
      if (uVar15 == 0) {
        iVar4 = this->total_size + 0x10;
        uVar15 = 0;
      }
      else {
        uVar9 = 0;
        do {
          this->delta_buffer[uVar9] = this->delta_buffer[uVar9] - iVar13;
          uVar9 = uVar9 + 1;
        } while (uVar15 != uVar9);
        iVar4 = this->total_size + 0x10;
        this->total_size = iVar4;
        if ((uVar15 & 0x1f) != 0) {
          uVar5 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar15 & 0x1f);
          uVar15 = (uVar15 - uVar5) + 0x20;
          iVar4 = this->total_size;
        }
      }
      this->total_size = (bVar8 * uVar15 >> 3) + iVar4;
      return true;
    }
  }
  if (this->can_do_for == true) {
    if (*piVar1 == 0) {
      uVar15 = 0;
    }
    else {
      bVar8 = 0;
      uVar14 = *piVar1;
      do {
        bVar8 = bVar8 + 1;
        bVar3 = 1 < uVar14;
        uVar14 = (int)uVar14 >> 1;
      } while (bVar3);
      bVar10 = 0x20;
      if (bVar8 < 0x1d) {
        bVar10 = bVar8;
      }
      uVar15 = (ulong)bVar10;
    }
    uVar9 = this->compression_buffer_idx;
    if (uVar9 == 0) {
      uVar9 = 0;
    }
    else {
      piVar1 = this->compression_buffer;
      iVar13 = this->minimum;
      uVar11 = 0;
      do {
        piVar1[uVar11] = piVar1[uVar11] - iVar13;
        uVar11 = uVar11 + 1;
      } while (uVar9 != uVar11);
      if ((uVar9 & 0x1f) != 0) {
        uVar5 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar9 & 0x1f);
        uVar9 = (uVar9 - uVar5) + 0x20;
      }
    }
    this->total_size = this->total_size + (uVar9 * uVar15 >> 3) + 0xc;
  }
  else {
    bVar12 = false;
  }
  return bVar12;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}